

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

bool __thiscall
vkt::api::anon_unknown_0::BlittingImages::checkLinearFilteredResult
          (BlittingImages *this,ConstPixelBufferAccess *result,
          ConstPixelBufferAccess *clampedExpected,ConstPixelBufferAccess *unclampedExpected,
          TextureFormat *srcFormat)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *this_00;
  ConstPixelBufferAccess *pCVar2;
  bool bVar3;
  int i;
  TextureChannelClass TVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 uVar9;
  TextureFormat dstFormat;
  Vec4 srcMaxDiff;
  Vec4 threshold;
  Vec4 dstMaxDiff;
  string local_100;
  string local_e0;
  TextureFormat local_c0;
  UVec4 local_b8;
  LogSection local_a0;
  ConstPixelBufferAccess *local_60;
  Vec4 local_58;
  tcu local_40 [16];
  
  this_00 = ((this->super_CopiesAndBlittingTestInstance).super_TestInstance.m_context)->m_testCtx->
            m_log;
  local_c0 = result->m_format;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ClampedSourceImage","");
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"Region with clamped edges on source image.","");
  tcu::LogSection::LogSection(&local_a0,&local_e0,&local_100);
  local_60 = unclampedExpected;
  tcu::TestLog::startSection
            (this_00,local_a0.m_name._M_dataplus._M_p,local_a0.m_description._M_dataplus._M_p);
  paVar1 = &local_a0.m_description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_description._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_description._M_dataplus._M_p,
                    local_a0.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_name._M_dataplus._M_p != &local_a0.m_name.field_2) {
    operator_delete(local_a0.m_name._M_dataplus._M_p,
                    local_a0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  TVar4 = tcu::getTextureChannelClass(local_c0.type);
  if (TVar4 == TEXTURECHANNELCLASS_FLOATING_POINT) {
    bVar3 = tcu::isSRGB(*srcFormat);
    getFormatThreshold((anon_unknown_0 *)&local_a0,srcFormat);
    if (bVar3) {
      uVar9 = 0x40000000;
    }
    else {
      uVar9 = 0x3f800000;
    }
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&local_e0._M_dataplus._M_p + lVar5 * 4) = uVar9;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_b8.m_data[0] = 0;
    local_b8.m_data[1] = 0;
    local_b8.m_data[2] = 0;
    local_b8.m_data[3] = 0;
    lVar5 = 0;
    do {
      local_b8.m_data[lVar5] =
           (uint)(*(float *)((long)&local_a0.m_name._M_dataplus._M_p + lVar5 * 4) *
                 *(float *)((long)&local_e0._M_dataplus._M_p + lVar5 * 4));
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    getFormatThreshold((anon_unknown_0 *)local_40,&local_c0);
    local_58.m_data[0] = 0.0;
    local_58.m_data[1] = 0.0;
    local_58.m_data[2] = 0.0;
    local_58.m_data[3] = 0.0;
    lVar5 = 0;
    do {
      uVar8 = -(uint)(*(float *)(local_40 + lVar5 * 4) <= (float)local_b8.m_data[lVar5]);
      local_58.m_data[lVar5] =
           (float)(~uVar8 & (uint)*(float *)(local_40 + lVar5 * 4) | local_b8.m_data[lVar5] & uVar8)
      ;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    bVar3 = tcu::floatThresholdCompare
                      (this_00,"Compare","Result comparsion",clampedExpected,result,&local_58,
                       COMPARE_LOG_RESULT);
    tcu::TestLog::endSection(this_00);
    if (bVar3) {
      return bVar3;
    }
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"NonClampedSourceImage","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Region with non-clamped edges on source image.","");
    tcu::LogSection::LogSection(&local_a0,&local_e0,&local_100);
    tcu::TestLog::startSection
              (this_00,local_a0.m_name._M_dataplus._M_p,local_a0.m_description._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.m_description._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.m_description._M_dataplus._M_p,
                      local_a0.m_description.field_2._M_allocated_capacity + 1);
    }
    pCVar2 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.m_name._M_dataplus._M_p != &local_a0.m_name.field_2) {
      operator_delete(local_a0.m_name._M_dataplus._M_p,
                      local_a0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = tcu::floatThresholdCompare
                      (this_00,"Compare","Result comparsion",pCVar2,result,&local_58,
                       COMPARE_LOG_RESULT);
  }
  else {
    local_b8.m_data[0] = 0;
    local_b8.m_data[1] = 0;
    local_b8.m_data[2] = 0;
    local_b8.m_data[3] = 0;
    tcu::getTextureFormatBitDepth(local_40,&local_c0);
    lVar5 = 0;
    do {
      iVar7 = 1 << ((byte)local_40[lVar5 * 4] & 0x1f);
      iVar6 = iVar7 + 0xff;
      if (-1 < iVar7) {
        iVar6 = iVar7;
      }
      uVar8 = iVar6 >> 8;
      if ((int)uVar8 < 2) {
        uVar8 = 1;
      }
      local_b8.m_data[lVar5] = uVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    bVar3 = tcu::intThresholdCompare
                      (this_00,"Compare","Result comparsion",clampedExpected,result,&local_b8,
                       COMPARE_LOG_RESULT);
    tcu::TestLog::endSection(this_00);
    if (bVar3) {
      return bVar3;
    }
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"NonClampedSourceImage","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Region with non-clamped edges on source image.","");
    tcu::LogSection::LogSection(&local_a0,&local_e0,&local_100);
    tcu::TestLog::startSection
              (this_00,local_a0.m_name._M_dataplus._M_p,local_a0.m_description._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.m_description._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.m_description._M_dataplus._M_p,
                      local_a0.m_description.field_2._M_allocated_capacity + 1);
    }
    pCVar2 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.m_name._M_dataplus._M_p != &local_a0.m_name.field_2) {
      operator_delete(local_a0.m_name._M_dataplus._M_p,
                      local_a0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = tcu::intThresholdCompare
                      (this_00,"Compare","Result comparsion",pCVar2,result,&local_b8,
                       COMPARE_LOG_RESULT);
  }
  tcu::TestLog::endSection(this_00);
  return bVar3;
}

Assistant:

bool BlittingImages::checkLinearFilteredResult (const tcu::ConstPixelBufferAccess&	result,
												const tcu::ConstPixelBufferAccess&	clampedExpected,
												const tcu::ConstPixelBufferAccess&	unclampedExpected,
												const tcu::TextureFormat&			srcFormat)
{
	tcu::TestLog&				log			(m_context.getTestContext().getLog());
	const tcu::TextureFormat	dstFormat	= result.getFormat();
	bool						isOk		= false;

	log << tcu::TestLog::Section("ClampedSourceImage", "Region with clamped edges on source image.");

	if (isFloatFormat(dstFormat))
	{
		const bool		srcIsSRGB	= tcu::isSRGB(srcFormat);
		const tcu::Vec4	srcMaxDiff	= getFormatThreshold(srcFormat) * tcu::Vec4(srcIsSRGB ? 2.0f : 1.0f);
		const tcu::Vec4	dstMaxDiff	= getFormatThreshold(dstFormat);
		const tcu::Vec4	threshold	= tcu::max(srcMaxDiff, dstMaxDiff);

		isOk = tcu::floatThresholdCompare(log, "Compare", "Result comparsion", clampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
		log << tcu::TestLog::EndSection;

		if (!isOk)
		{
			log << tcu::TestLog::Section("NonClampedSourceImage", "Region with non-clamped edges on source image.");
			isOk = tcu::floatThresholdCompare(log, "Compare", "Result comparsion", unclampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
			log << tcu::TestLog::EndSection;
		}
	}
	else
	{
		tcu::UVec4	threshold;
		// Calculate threshold depending on channel width of destination format.
		const tcu::IVec4	bitDepth	= tcu::getTextureFormatBitDepth(dstFormat);
		for (deUint32 i = 0; i < 4; ++i)
			threshold[i] = de::max( (0x1 << bitDepth[i]) / 256, 1);

		isOk = tcu::intThresholdCompare(log, "Compare", "Result comparsion", clampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
		log << tcu::TestLog::EndSection;

		if (!isOk)
		{
			log << tcu::TestLog::Section("NonClampedSourceImage", "Region with non-clamped edges on source image.");
			isOk = tcu::intThresholdCompare(log, "Compare", "Result comparsion", unclampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
			log << tcu::TestLog::EndSection;
		}
	}

	return isOk;
}